

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed)

{
  cmRuntimeDependencyArchive *this_00;
  string *psVar1;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *this_01;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string local_228;
  string *local_208;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *local_200;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  cmUVProcessChainBuilder builder;
  ostringstream e;
  
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)needed;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool).Archive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"dumpbin",(allocator<char> *)&line);
  bVar2 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)&e,&command);
  std::__cxx11::string::~string((string *)&e);
  if (bVar2) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (char (*) [12])"/dependents");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,file);
    cmUVProcessChainBuilder::AddCommand(&builder,&command);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&process);
    bVar2 = cmUVProcessChain::Valid(&process);
    if (bVar2) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      local_208 = file;
      local_200 = &this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool;
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::regex == '\0') {
        iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex);
        if (iVar3 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::regex,"^    ([^\n]*\\.[Dd][Ll][Ll])\r$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::regex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::regex);
        }
      }
      while( true ) {
        piVar4 = cmUVProcessChain::OutputStream(&process);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (piVar4,(string *)&line);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        _e = (pointer)0x0;
        bVar2 = cmsys::RegularExpression::find
                          (&GetFileInfo::regex,line._M_dataplus._M_p,(RegularExpressionMatch *)&e);
        if (bVar2) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_228,(RegularExpressionMatch *)&e,1)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1f8,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
        }
      }
      bVar2 = cmUVProcessChain::Wait(&process,-1);
      this_01 = local_200;
      psVar1 = local_208;
      if (bVar2) {
        cmUVProcessChain::GetStatus(&status,&process);
        if ((*status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start == (Status *)0x0) ||
           ((*status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,"Failed to run dumpbin on:\n  ");
          std::operator<<(poVar5,(string *)psVar1);
          std::__cxx11::stringbuf::str();
          cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          bVar2 = false;
        }
        else {
          bVar2 = true;
        }
        std::
        _Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
        ::~_Vector_base(&status.
                         super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                       );
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"Failed to wait on dumpbin process for:\n  ");
        std::operator<<(poVar5,(string *)psVar1);
        std::__cxx11::stringbuf::str();
        cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&line);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"Failed to start dumpbin process for:\n  ");
      std::operator<<(poVar5,(string *)file);
      std::__cxx11::stringbuf::str();
      cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,&line);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar2 = false;
    }
    cmUVProcessChain::~cmUVProcessChain(&process);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"Could not find dumpbin",(allocator<char> *)&line);
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&builder.Processes);
  return bVar2;
}

Assistant:

bool cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool::GetFileInfo(
  const std::string& file, std::vector<std::string>& needed)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("dumpbin", command)) {
    this->SetError("Could not find dumpbin");
    return false;
  }
  command.emplace_back("/dependents");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start dumpbin process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex(
    "^    ([^\n]*\\.[Dd][Ll][Ll])\r$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on dumpbin process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run dumpbin on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}